

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_type_enums
                 (lysc_ctx *ctx,lysp_type_enum *enums_p,LY_DATA_TYPE basetype,
                 lysc_type_bitenum_item *base_enums,lysc_type_bitenum_item **bitenums)

{
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  lysc_type_bitenum_item **pplVar4;
  anon_union_4_2_241f96ab_for_lysc_type_bitenum_item_4 *paVar5;
  int iVar6;
  uint uVar7;
  LY_ERR LVar8;
  long *plVar9;
  void *pvVar10;
  lysp_ext_instance *plVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  lysp_ext_instance *plVar15;
  char *format;
  anon_union_4_2_241f96ab_for_lysc_type_bitenum_item_4 *paVar16;
  size_t __n;
  lysp_type_enum *plVar17;
  long lVar18;
  uint uVar19;
  lysp_ext_instance *plVar20;
  ulong uVar21;
  ulong uVar22;
  ly_ctx *plVar23;
  char *pcVar24;
  long lVar25;
  uint *puVar26;
  lysc_type_bitenum_item *plVar27;
  long lVar28;
  undefined8 in_stack_ffffffffffffff28;
  ly_bool enabled;
  ulong local_c0;
  uint local_b4;
  uint local_b0;
  LY_DATA_TYPE local_ac;
  ulong local_a8;
  lysc_type_bitenum_item **local_a0;
  ulong local_98;
  lysp_type_enum *local_90;
  lysc_type_bitenum_item *local_88;
  lysc_ctx *local_80;
  lysp_type_enum *local_78;
  int local_6c;
  long local_68;
  char **local_60;
  lysc_type_bitenum_item storage;
  
  if ((base_enums != (lysc_type_bitenum_item *)0x0) && (ctx->pmod->version < 2)) {
    plVar23 = ctx->ctx;
    pcVar24 = "Bits";
    if (basetype == LY_TYPE_ENUM) {
      pcVar24 = "Enumeration";
    }
    pcVar13 = "%s type can be subtyped only in YANG 1.1 modules.";
LAB_00143963:
    ly_vlog(plVar23,(char *)0x0,LYVE_SYNTAX_YANG,pcVar13,pcVar24);
    return LY_EVALID;
  }
  local_68 = 0;
  local_98 = 0x80000000;
  local_6c = (uint)(basetype == LY_TYPE_ENUM) << 9;
  local_c0 = 0;
  lVar25 = 0;
  local_b0 = 0x80000000;
  local_a8 = 0;
  local_b4 = 0;
  local_ac = basetype;
  local_a0 = bitenums;
  local_88 = base_enums;
  do {
    if (enums_p == (lysp_type_enum *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = *(ulong *)&enums_p[-1].flags;
    }
    if (uVar12 <= local_c0) {
      return LY_SUCCESS;
    }
    if (local_88 != (lysc_type_bitenum_item *)0x0) {
      plVar17 = enums_p + local_c0;
      lVar18._0_4_ = local_88[-1].field_4;
      lVar18._4_2_ = local_88[-1].flags;
      lVar18._6_2_ = *(undefined2 *)&local_88[-1].field_0x26;
      lVar25 = 0;
      plVar27 = local_88;
      while( true ) {
        if (lVar18 == lVar25) goto LAB_00143ea6;
        iVar6 = strcmp(plVar17->name,plVar27->name);
        if (iVar6 == 0) break;
        lVar25 = lVar25 + 1;
        plVar27 = plVar27 + 1;
      }
      if (lVar18 == lVar25) {
LAB_00143ea6:
        pcVar24 = "bits";
        if (local_ac == LY_TYPE_ENUM) {
          pcVar24 = "enumeration";
        }
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid %s - derived type adds new item \"%s\".",pcVar24,plVar17->name);
        return LY_EVALID;
      }
    }
    uVar12 = local_c0;
    plVar17 = enums_p + local_c0;
    local_90 = enums_p;
    if (local_ac == LY_TYPE_ENUM) {
      uVar7 = (uint)local_98;
      if ((enums_p[local_c0].flags >> 9 & 1) == 0) {
        if (local_88 == (lysc_type_bitenum_item *)0x0) {
          if (local_c0 == 0) {
            uVar19 = 0;
          }
          else {
            if (uVar7 == 0x7fffffff) {
              plVar23 = ctx->ctx;
              pcVar24 = plVar17->name;
              pcVar13 = 
              "Invalid enumeration - it is not possible to auto-assign enum value for \"%s\" since the highest value is already 2147483647."
              ;
              goto LAB_00143963;
            }
            uVar19 = uVar7 + 1;
          }
        }
        else {
          uVar19 = local_88[lVar25].field_4.value;
        }
      }
      else {
        uVar19 = (uint)plVar17->value;
        plVar27 = *local_a0;
        uVar14 = 0xffffffffffffffff;
        paVar5 = &plVar27->field_4;
        while( true ) {
          paVar16 = paVar5;
          if (plVar27 == (lysc_type_bitenum_item *)0x0) {
            uVar21 = 0;
          }
          else {
            uVar21._0_4_ = plVar27[-1].field_4;
            uVar21._4_2_ = plVar27[-1].flags;
            uVar21._6_2_ = *(undefined2 *)&plVar27[-1].field_0x26;
          }
          uVar14 = uVar14 + 1;
          if (uVar21 <= uVar14) break;
          paVar5 = paVar16 + 10;
          if (paVar16->value == uVar19) {
            plVar23 = ctx->ctx;
            pcVar24 = plVar17->name;
            pcVar13 = ((lysc_type_bitenum_item *)(paVar16 + -8))->name;
            format = "Invalid enumeration - value %d collide in items \"%s\" and \"%s\".";
LAB_00143f07:
            ly_vlog(plVar23,(char *)0x0,LYVE_SYNTAX_YANG,format,(ulong)uVar19,pcVar24,pcVar13);
            return LY_EVALID;
          }
        }
      }
      if ((int)uVar7 <= (int)uVar19) {
        uVar7 = uVar19;
      }
      local_98 = (ulong)uVar7;
      local_b0 = uVar19;
    }
    else {
      uVar7 = (uint)local_a8;
      if ((enums_p[local_c0].flags >> 9 & 1) == 0) {
        if (local_88 == (lysc_type_bitenum_item *)0x0) {
          if (local_c0 == 0) {
            uVar19 = 0;
          }
          else {
            if (uVar7 == 0xffffffff) {
              plVar23 = ctx->ctx;
              pcVar24 = plVar17->name;
              pcVar13 = 
              "Invalid bits - it is not possible to auto-assign bit position for \"%s\" since the highest value is already 4294967295."
              ;
              goto LAB_00143963;
            }
            uVar19 = uVar7 + 1;
          }
        }
        else {
          uVar19 = local_88[lVar25].field_4.position;
        }
      }
      else {
        uVar19 = (uint)plVar17->value;
        plVar27 = *local_a0;
        uVar14 = 0xffffffffffffffff;
        paVar5 = &plVar27->field_4;
        while( true ) {
          paVar16 = paVar5;
          if (plVar27 == (lysc_type_bitenum_item *)0x0) {
            uVar22 = 0;
          }
          else {
            uVar22._0_4_ = plVar27[-1].field_4;
            uVar22._4_2_ = plVar27[-1].flags;
            uVar22._6_2_ = *(undefined2 *)&plVar27[-1].field_0x26;
          }
          uVar14 = uVar14 + 1;
          if (uVar22 <= uVar14) break;
          paVar5 = paVar16 + 10;
          if (paVar16->value == uVar19) {
            plVar23 = ctx->ctx;
            pcVar24 = plVar17->name;
            pcVar13 = ((lysc_type_bitenum_item *)(paVar16 + -8))->name;
            format = "Invalid bits - position %u collide in items \"%s\" and \"%s\".";
            goto LAB_00143f07;
          }
        }
      }
      if (uVar7 <= uVar19) {
        uVar7 = uVar19;
      }
      local_a8 = (ulong)uVar7;
      local_b4 = uVar19;
    }
    if (local_88 != (lysc_type_bitenum_item *)0x0) {
      uVar7 = local_88[lVar25].field_4.position;
      if (local_ac == LY_TYPE_ENUM) {
        if (local_b0 != uVar7) {
          plVar23 = ctx->ctx;
          pcVar24 = enums_p[local_c0].name;
          pcVar13 = 
          "Invalid enumeration - value of the item \"%s\" has changed from %d to %d in the derived type."
          ;
          uVar19 = local_b0;
LAB_00143fa6:
          ly_vlog(plVar23,(char *)0x0,LYVE_SYNTAX_YANG,pcVar13,pcVar24,(ulong)uVar7,
                  CONCAT44((int)((ulong)in_stack_ffffffffffffff28 >> 0x20),uVar19));
          return LY_EVALID;
        }
      }
      else if (local_b4 != uVar7) {
        plVar23 = ctx->ctx;
        pcVar24 = enums_p[local_c0].name;
        pcVar13 = 
        "Invalid bits - position of the item \"%s\" has changed from %u to %u in the derived type.";
        uVar19 = local_b4;
        goto LAB_00143fa6;
      }
    }
    plVar27 = *local_a0;
    local_78 = plVar17;
    if (plVar27 == (lysc_type_bitenum_item *)0x0) {
      plVar9 = (long *)malloc(0x30);
      if (plVar9 == (long *)0x0) goto LAB_00143f45;
      *plVar9 = 1;
      lVar18 = 1;
    }
    else {
      lVar18 = *(long *)&plVar27[-1].field_4;
      *(long *)&plVar27[-1].field_4 = lVar18 + 1;
      plVar9 = (long *)realloc(&plVar27[-1].field_4,lVar18 * 0x28 + 0x30);
      if (plVar9 == (long *)0x0) {
        *(long *)&(*local_a0)[-1].field_4 = *(long *)&(*local_a0)[-1].field_4 + -1;
LAB_00143f45:
        plVar23 = ctx->ctx;
        goto LAB_00143f4e;
      }
      lVar18 = *plVar9;
    }
    *local_a0 = (lysc_type_bitenum_item *)(plVar9 + 1);
    plVar1 = plVar9 + lVar18 * 5;
    local_60 = (char **)(plVar1 + -4);
    *plVar1 = 0;
    plVar1[-2] = 0;
    plVar1[-1] = 0;
    *local_60 = (char *)0x0;
    plVar1[-3] = 0;
    LVar8 = lydict_dup(ctx->ctx,local_90[uVar12].name,local_60);
    plVar17 = local_78;
    if (LVar8 != LY_SUCCESS) {
      return LVar8;
    }
    puVar26 = (uint *)(plVar9 + lVar18 * 5);
    LVar8 = lydict_dup(ctx->ctx,local_78->dsc,(char **)(puVar26 + -6));
    if (LVar8 != LY_SUCCESS) {
      return LVar8;
    }
    LVar8 = lydict_dup(ctx->ctx,plVar17->ref,(char **)(puVar26 + -4));
    if (LVar8 != LY_SUCCESS) {
      return LVar8;
    }
    *(ushort *)(puVar26 + 1) = (ushort)(byte)plVar17->flags | (ushort)local_6c;
    *puVar26 = uVar19;
    plVar20 = plVar17->exts;
    local_80 = ctx;
    if (plVar20 != (lysp_ext_instance *)0x0) {
      lVar18 = *(long *)(puVar26 + -2);
      if (lVar18 == 0) {
        pvVar10 = calloc(1,(long)plVar20[-1].exts * 0x48 + 8);
        if (pvVar10 == (void *)0x0) goto LAB_00143f4b;
        plVar9 = (long *)((long)pvVar10 + 8);
        *(long **)(puVar26 + -2) = plVar9;
        lVar28 = 0;
LAB_00143ce6:
        plVar15 = plVar20[-1].exts;
      }
      else {
        lVar28 = *(long *)(lVar18 + -8);
        plVar9 = (long *)realloc((void *)(lVar18 + -8),
                                 ((long)&(plVar20[-1].exts)->name + lVar28 * 2) * 0x48 + 8);
        if (plVar9 == (long *)0x0) {
LAB_00143f4b:
          plVar23 = local_80->ctx;
LAB_00143f4e:
          ly_log(plVar23,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_type_enums");
          return LY_EMEM;
        }
        plVar20 = local_78->exts;
        lVar18 = *plVar9;
        *(long **)(puVar26 + -2) = plVar9 + 1;
        plVar9 = plVar9 + lVar18 * 9 + 1;
        if (plVar20 != (lysp_ext_instance *)0x0) goto LAB_00143ce6;
        plVar20 = (lysp_ext_instance *)0x0;
        plVar15 = (lysp_ext_instance *)0x0;
      }
      memset(plVar9,0,((long)&plVar15->name + lVar28) * 0x48);
      lVar18 = 0;
      plVar15 = (lysp_ext_instance *)0x0;
      while( true ) {
        if (plVar20 == (lysp_ext_instance *)0x0) {
          plVar11 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar11 = plVar20[-1].exts;
        }
        if (plVar11 <= plVar15) break;
        lVar28 = *(long *)(puVar26 + -2);
        lVar3 = *(long *)(lVar28 + -8);
        *(long *)(lVar28 + -8) = lVar3 + 1;
        LVar8 = lys_compile_ext(local_80,(lysp_ext_instance *)((long)&plVar20->name + lVar18),
                                (lysc_ext_instance *)(lVar3 * 0x48 + lVar28),local_60);
        if (LVar8 != LY_SUCCESS) {
          if (LVar8 != LY_ENOT) {
            return LVar8;
          }
          *(long *)(*(long *)(puVar26 + -2) + -8) = *(long *)(*(long *)(puVar26 + -2) + -8) + -1;
        }
        plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
        plVar20 = local_78->exts;
        lVar18 = lVar18 + 0x70;
      }
    }
    ctx = local_80;
    LVar8 = lys_eval_iffeatures(local_80->ctx,local_78->iffeatures,&enabled);
    enums_p = local_90;
    pplVar4 = local_a0;
    if (LVar8 != LY_SUCCESS) {
      return LVar8;
    }
    if (enabled == '\0') {
      *(byte *)((long)puVar26 + 5) = *(byte *)((long)puVar26 + 5) | 1;
    }
    if (local_ac == LY_TYPE_BITS) {
      uVar12 = 0;
      __n = 0;
      for (lVar18 = local_68;
          (local_c0 != uVar12 && (*puVar26 < *(uint *)((long)*local_a0 + lVar18 + -8)));
          lVar18 = lVar18 + -0x28) {
        __n = __n + 0x28;
        uVar12 = uVar12 + 1;
      }
      if (uVar12 != 0) {
        storage._32_8_ = local_60[4];
        storage.name = *local_60;
        storage.dsc = local_60[1];
        storage.ref = local_60[2];
        storage.exts = (lysc_ext_instance *)local_60[3];
        memmove((void *)((long)&(*local_a0)[1].name + lVar18),
                (void *)((long)&(*local_a0)->name + lVar18),__n);
        plVar27 = *pplVar4;
        puVar2 = (undefined8 *)((long)&plVar27->name + lVar18);
        *puVar2 = storage.name;
        puVar2[1] = storage.dsc;
        puVar2 = (undefined8 *)((long)&plVar27->ref + lVar18);
        *puVar2 = storage.ref;
        puVar2[1] = storage.exts;
        *(undefined8 *)((long)&plVar27->field_4 + lVar18) = storage._32_8_;
      }
    }
    local_c0 = local_c0 + 1;
    local_68 = local_68 + 0x28;
  } while( true );
}

Assistant:

LY_ERR
lys_compile_type_enums(struct lysc_ctx *ctx, const struct lysp_type_enum *enums_p, LY_DATA_TYPE basetype,
        struct lysc_type_bitenum_item *base_enums, struct lysc_type_bitenum_item **bitenums)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v, match = 0;
    int32_t highest_value = INT32_MIN, cur_val = INT32_MIN;
    uint32_t highest_position = 0, cur_pos = 0;
    struct lysc_type_bitenum_item *e, storage;
    ly_bool enabled;

    if (base_enums && (ctx->pmod->version < LYS_VERSION_1_1)) {
        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "%s type can be subtyped only in YANG 1.1 modules.",
                basetype == LY_TYPE_ENUM ? "Enumeration" : "Bits");
        return LY_EVALID;
    }

    LY_ARRAY_FOR(enums_p, u) {
        /* perform all checks */
        if (base_enums) {
            /* check the enum/bit presence in the base type - the set of enums/bits in the derived type must be a subset */
            LY_ARRAY_FOR(base_enums, v) {
                if (!strcmp(enums_p[u].name, base_enums[v].name)) {
                    break;
                }
            }
            if (v == LY_ARRAY_COUNT(base_enums)) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s - derived type adds new item \"%s\".",
                        basetype == LY_TYPE_ENUM ? "enumeration" : "bits", enums_p[u].name);
                return LY_EVALID;
            }
            match = v;
        }

        if (basetype == LY_TYPE_ENUM) {
            if (enums_p[u].flags & LYS_SET_VALUE) {
                /* value assigned by model */
                cur_val = (int32_t)enums_p[u].value;
                /* check collision with other values */
                LY_ARRAY_FOR(*bitenums, v) {
                    if (cur_val == (*bitenums)[v].value) {
                        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                                "Invalid enumeration - value %" PRId32 " collide in items \"%s\" and \"%s\".",
                                cur_val, enums_p[u].name, (*bitenums)[v].name);
                        return LY_EVALID;
                    }
                }
            } else if (base_enums) {
                /* inherit the assigned value */
                cur_val = base_enums[match].value;
            } else {
                /* assign value automatically */
                if (u == 0) {
                    cur_val = 0;
                } else if (highest_value == INT32_MAX) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid enumeration - it is not possible to auto-assign enum value for "
                            "\"%s\" since the highest value is already 2147483647.", enums_p[u].name);
                    return LY_EVALID;
                } else {
                    cur_val = highest_value + 1;
                }
            }

            /* save highest value for auto assing */
            if (highest_value < cur_val) {
                highest_value = cur_val;
            }
        } else { /* LY_TYPE_BITS */
            if (enums_p[u].flags & LYS_SET_VALUE) {
                /* value assigned by model */
                cur_pos = (uint32_t)enums_p[u].value;
                /* check collision with other values */
                LY_ARRAY_FOR(*bitenums, v) {
                    if (cur_pos == (*bitenums)[v].position) {
                        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                                "Invalid bits - position %" PRIu32 " collide in items \"%s\" and \"%s\".",
                                cur_pos, enums_p[u].name, (*bitenums)[v].name);
                        return LY_EVALID;
                    }
                }
            } else if (base_enums) {
                /* inherit the assigned value */
                cur_pos = base_enums[match].position;
            } else {
                /* assign value automatically */
                if (u == 0) {
                    cur_pos = 0;
                } else if (highest_position == UINT32_MAX) {
                    /* counter overflow */
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid bits - it is not possible to auto-assign bit position for "
                            "\"%s\" since the highest value is already 4294967295.", enums_p[u].name);
                    return LY_EVALID;
                } else {
                    cur_pos = highest_position + 1;
                }
            }

            /* save highest position for auto assing */
            if (highest_position < cur_pos) {
                highest_position = cur_pos;
            }
        }

        /* the assigned values must not change from the derived type */
        if (base_enums) {
            if (basetype == LY_TYPE_ENUM) {
                if (cur_val != base_enums[match].value) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid enumeration - value of the item \"%s\" has changed from %" PRId32 " to %" PRId32
                            " in the derived type.", enums_p[u].name, base_enums[match].value, cur_val);
                    return LY_EVALID;
                }
            } else {
                if (cur_pos != base_enums[match].position) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid bits - position of the item \"%s\" has changed from %" PRIu32 " to %" PRIu32
                            " in the derived type.", enums_p[u].name, base_enums[match].position, cur_pos);
                    return LY_EVALID;
                }
            }
        }

        /* add new enum/bit */
        LY_ARRAY_NEW_RET(ctx->ctx, *bitenums, e, LY_EMEM);
        DUP_STRING_GOTO(ctx->ctx, enums_p[u].name, e->name, ret, done);
        DUP_STRING_GOTO(ctx->ctx, enums_p[u].dsc, e->dsc, ret, done);
        DUP_STRING_GOTO(ctx->ctx, enums_p[u].ref, e->ref, ret, done);
        e->flags = (enums_p[u].flags & LYS_FLAGS_COMPILED_MASK) | (basetype == LY_TYPE_ENUM ? LYS_IS_ENUM : 0);
        if (basetype == LY_TYPE_ENUM) {
            e->value = cur_val;
        } else {
            e->position = cur_pos;
        }
        COMPILE_EXTS_GOTO(ctx, enums_p[u].exts, e->exts, e, ret, done);

        /* evaluate if-ffeatures */
        LY_CHECK_RET(lys_eval_iffeatures(ctx->ctx, enums_p[u].iffeatures, &enabled));
        if (!enabled) {
            /* set only flag, later resolved and removed */
            e->flags |= LYS_DISABLED;
        }

        if (basetype == LY_TYPE_BITS) {
            /* keep bits ordered by position */
            for (v = u; v && (*bitenums)[v - 1].position > e->position; --v) {}
            if (v != u) {
                memcpy(&storage, e, sizeof *e);
                memmove(&(*bitenums)[v + 1], &(*bitenums)[v], (u - v) * sizeof **bitenums);
                memcpy(&(*bitenums)[v], &storage, sizeof storage);
            }
        }
    }

done:
    return ret;
}